

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O3

string * __thiscall
soul::SourceCodeUtilities::getFileSummaryBody_abi_cxx11_
          (string *__return_storage_ptr__,SourceCodeUtilities *this,Comment *summary)

{
  long *plVar1;
  pointer pbVar2;
  int iVar3;
  uint uVar4;
  string *psVar6;
  bool bVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  string firstLine;
  pointer local_c8;
  string *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [17];
  undefined7 uStack_97;
  undefined8 uStack_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_70;
  string local_50;
  string *psVar5;
  
  if ((*this == (SourceCodeUtilities)0x1) &&
     (plVar1 = *(long **)(this + 8), plVar1 != *(long **)(this + 0x10))) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,*plVar1,plVar1[1] + *plVar1);
    choc::text::trim(&local_70,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_c8 = (pointer)local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,local_70._M_dataplus._M_p,
               local_70._M_dataplus._M_p + local_70._M_string_length);
    psVar5 = local_c0;
    pbVar2 = local_c8;
    if (local_c0 != (string *)0x0) {
      psVar6 = (string *)0x0;
      do {
        iVar3 = tolower((int)*(char *)((long)&(pbVar2->_M_dataplus)._M_p +
                                      (long)&(psVar6->_M_dataplus)._M_p));
        *(char *)((long)&(pbVar2->_M_dataplus)._M_p + (long)&(psVar6->_M_dataplus)._M_p) =
             (char)iVar3;
        psVar6 = (string *)((long)&(psVar6->_M_dataplus)._M_p + 1);
      } while (psVar5 != psVar6);
    }
    psVar5 = local_c0;
    if (local_c8 == (pointer)local_b8) {
      uStack_90 = local_b8._8_8_;
      local_c8 = (pointer)(local_a8 + 0x10);
    }
    stack0xffffffffffffff68 = (pointer)CONCAT71(local_b8._1_7_,local_b8[0]);
    local_a8._8_8_ = local_c0;
    local_c0 = (string *)0x0;
    local_b8[0] = 0;
    if (psVar5 < (string *)0x6) {
      bVar7 = false;
    }
    else {
      uVar4 = *(uint *)&(local_c8->_M_dataplus)._M_p ^ 0x6c746974;
      psVar5 = (string *)(ulong)uVar4;
      bVar7 = *(short *)((long)&(local_c8->_M_dataplus)._M_p + 4) == 0x3a65 && uVar4 == 0;
    }
    pbVar2 = (pointer)local_b8;
    local_a8._0_8_ = local_c8;
    if ((local_c8 != (pointer)(local_a8 + 0x10)) &&
       (local_c8 = (pointer)local_b8,
       operator_delete((void *)local_a8._0_8_,
                       (ulong)((long)&(stack0xffffffffffffff68->_M_dataplus)._M_p + 1)),
       pbVar2 = local_c8, local_c8 != (pointer)local_b8)) {
      operator_delete(local_c8,CONCAT71(local_b8._1_7_,local_b8[0]) + 1);
      pbVar2 = local_c8;
    }
    local_c8 = pbVar2;
    if (bVar7) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_88,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(this + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(&local_88,
                 (iterator)
                 local_88.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      while ((local_88.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_88.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish &&
             ((local_88.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length == 0))) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(&local_88,
                   (iterator)
                   local_88.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      local_a8._0_8_ = (pointer)(local_a8 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"\n","");
      joinStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (__return_storage_ptr__,(soul *)&local_88,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a8,psVar5);
      if ((pointer)local_a8._0_8_ != (pointer)(local_a8 + 0x10)) {
        operator_delete((void *)local_a8._0_8_,
                        (ulong)((long)&(stack0xffffffffffffff68->_M_dataplus)._M_p + 1));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (bVar7) {
      return __return_storage_ptr__;
    }
  }
  CodeLocationRange::toString_abi_cxx11_(__return_storage_ptr__,(CodeLocationRange *)(this + 0x20));
  return __return_storage_ptr__;
}

Assistant:

std::string SourceCodeUtilities::getFileSummaryBody (const Comment& summary)
{
    if (summary.valid && ! summary.lines.empty())
    {
        auto firstLine = choc::text::trim (summary.lines[0]);

        if (choc::text::startsWith (toLowerCase (firstLine), "title:"))
        {
            auto lines = summary.lines;
            lines.erase (lines.begin());

            while (! lines.empty() && lines.front().empty())
                lines.erase (lines.begin());

            return joinStrings (lines, "\n");
        }
    }

    return summary.range.toString();
}